

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::transformAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *old_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_annots,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_fields,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *old_fields,
          QPDFMatrix *cm,QPDF *from_qpdf,QPDFAcroFormDocumentHelper *from_afdh)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  QPDFObjectHandle *pQVar2;
  Rectangle r;
  QPDFAcroFormDocumentHelper *this_00;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar4;
  int iVar5;
  reference pTVar6;
  string *key;
  size_type sVar7;
  mapped_type *value;
  reference pQVar8;
  bool local_10cb;
  byte local_1021;
  QPDFObjectHandle local_de0;
  allocator<char> local_dc9;
  string local_dc8;
  allocator<char> local_da1;
  string local_da0 [32];
  QPDFObjectHandle local_d80;
  Rectangle local_d70;
  undefined1 local_d50 [8];
  Rectangle rect;
  QPDFObjectHandle local_d00;
  allocator<char> local_ce9;
  string local_ce8 [32];
  undefined1 local_cc8 [8];
  QPDFObjectHandle resources;
  string local_cb0;
  QPDFMatrix local_c90;
  undefined1 local_c60 [8];
  QPDFObjectHandle new_matrix;
  undefined1 local_c20 [8];
  Matrix m1;
  QPDFMatrix apcm;
  string local_bb8 [32];
  undefined1 local_b98 [8];
  QPDFObjectHandle omatrix;
  QPDFObjectHandle dict;
  QPDFObjectHandle *stream;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2_1;
  type *local_b48;
  type *value2;
  type *key2;
  _Self local_b30;
  iterator __end4;
  iterator __begin4;
  Dictionary *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_af8;
  type *value1;
  type *key1;
  _Self local_ae0;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  undefined1 local_ab0 [7];
  anon_class_1_0_00000001 replace_stream;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  QPDFObjectHandle apdict;
  undefined1 local_a78 [8];
  QPDFAnnotationObjectHelper ah;
  QPDFObjectHandle local_a38;
  QPDFObjectHandle local_a28;
  QPDFObjectHandle local_a18;
  QPDFObjectHandle local_a08;
  QPDFObjectHandle local_9f8;
  QPDFFormFieldObjectHelper local_9e8;
  QPDFObjectHandle local_9b0;
  byte local_99c;
  byte local_99b;
  byte local_99a;
  allocator<char> local_999;
  string local_998 [32];
  QPDFObjectHandle local_978;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  QPDFObjectHandle local_918;
  undefined1 local_908 [8];
  QPDFObjectHandle kid;
  int i;
  undefined1 local_8d0 [8];
  QPDFObjectHandle kids;
  QPDFObjGen local_8a0;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  allocator<char> local_7f1;
  string local_7f0;
  QPDFObjGen local_7cc;
  QPDFObjGen parent_og;
  undefined1 local_7a0 [8];
  QPDFObjectHandle parent;
  value_type *obj;
  set seen;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  QPDFObjGen local_728;
  QPDFObjectHandle local_720;
  QPDFObjectHandle local_710;
  QPDFObjectHandle local_700;
  QPDFObjectHandle local_6f0;
  QPDFFormFieldObjectHelper local_6e0;
  undefined1 local_6a8 [24];
  string local_690;
  allocator<char> local_669;
  string local_668;
  bool local_642;
  byte local_641;
  undefined1 local_640 [6];
  bool have_parent;
  bool have_field;
  QPDFObjectHandle top_field;
  QPDFObjectHandle ffield_oh;
  QPDFAnnotationObjectHelper local_610;
  undefined1 local_5d8 [8];
  QPDFFormFieldObjectHelper ffield;
  string local_598;
  undefined1 local_578 [8];
  T annot;
  undefined1 local_560 [8];
  iterator __end1;
  iterator __begin1;
  QPDFArrayItems *__range1;
  set added_new_fields;
  anon_class_16_2_6a8246dc maybe_copy_object;
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  orig_to_copy;
  anon_class_56_7_e075e64c init_dr_map;
  QPDFObjectHandle dr;
  undefined1 local_438 [7];
  bool initialized_dr_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  dr_map;
  string local_400 [32];
  QPDFObjectHandle local_3e0;
  allocator<char> local_3c9;
  string local_3c8 [32];
  QPDFObjectHandle local_3a8;
  allocator<char> local_391;
  string local_390 [32];
  QPDFObjectHandle local_370;
  string local_360;
  allocator<char> local_339;
  string local_338 [32];
  QPDFObjectHandle local_318;
  QPDFObjectHandle local_308;
  QPDFObjectHandle local_2f8;
  QPDFObjectHandle local_2e8;
  QPDFObjectHandle local_2d8;
  allocator<char> local_2c1;
  string local_2c0 [32];
  QPDFObjectHandle local_2a0;
  allocator<char> local_289;
  string local_288 [32];
  QPDFObjectHandle local_268;
  allocator<char> local_251;
  string local_250 [32];
  QPDFObjectHandle local_230;
  allocator<char> local_219;
  string local_218 [32];
  QPDFObjectHandle local_1f8;
  allocator<char> local_1e1;
  string local_1e0 [32];
  QPDFObjectHandle local_1c0;
  string local_1b0;
  allocator<char> local_189;
  string local_188 [32];
  QPDFObjectHandle local_168;
  int local_154;
  undefined1 local_150 [4];
  int default_q;
  string default_da;
  QPDFObjectHandle from_dr;
  undefined1 local_118 [4];
  int from_default_q;
  string from_default_da;
  string local_f0 [5];
  bool override_q;
  bool override_da;
  undefined1 local_d0 [24];
  QPDFObjectHandle from_acroform;
  string local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  QPDFObjectHandle acroform;
  bool foreign;
  shared_ptr<QPDFAcroFormDocumentHelper> local_58;
  undefined1 local_48 [8];
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  QPDFMatrix *cm_local;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *old_fields_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_fields_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_annots_local;
  QPDFObjectHandle *old_annots_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cm;
  std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
            ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_48);
  if (from_qpdf == (QPDF *)0x0) {
    from_qpdf = (this->super_QPDFDocumentHelper).qpdf;
    from_afdh = this;
  }
  else if ((from_qpdf != (this->super_QPDFDocumentHelper).qpdf) &&
          (from_afdh == (QPDFAcroFormDocumentHelper *)0x0)) {
    std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_58);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::operator=
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_48,&local_58);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr(&local_58);
    from_afdh = std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                           local_48);
  }
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = from_qpdf != (this->super_QPDFDocumentHelper).qpdf;
  QPDF::getRoot((QPDF *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"/AcroForm",
             (allocator<char> *)
             ((long)&from_acroform.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&from_acroform.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
  QPDF::getRoot((QPDF *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"/AcroForm",(allocator<char> *)(from_default_da.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_d0 + 0x10),(string *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(from_default_da.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
  from_default_da.field_2._M_local_buf[0xe] = '\0';
  from_default_da.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)local_118);
  from_dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  QPDFObjectHandle::newNull();
  if ((acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._3_1_ & 1) != 0) {
    std::__cxx11::string::string((string *)local_150);
    local_154 = 0;
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_78);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"/DA",&local_189);
      QPDFObjectHandle::getKey(&local_168,(string *)local_78);
      bVar4 = QPDFObjectHandle::isString(&local_168);
      QPDFObjectHandle::~QPDFObjectHandle(&local_168);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1e0,"/DA",&local_1e1);
        QPDFObjectHandle::getKey(&local_1c0,(string *)local_78);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_1b0,&local_1c0);
        std::__cxx11::string::operator=((string *)local_150,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1c0);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_218,"/Q",&local_219);
      QPDFObjectHandle::getKey(&local_1f8,(string *)local_78);
      bVar4 = QPDFObjectHandle::isInteger(&local_1f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1f8);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator(&local_219);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_250,"/Q",&local_251);
        QPDFObjectHandle::getKey(&local_230,(string *)local_78);
        local_154 = QPDFObjectHandle::getIntValueAsInt(&local_230);
        QPDFObjectHandle::~QPDFObjectHandle(&local_230);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator(&local_251);
      }
    }
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_d0 + 0x10));
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_288,"/DR",&local_289);
      QPDFObjectHandle::getKey(&local_268,(string *)(local_d0 + 0x10));
      bVar4 = QPDFObjectHandle::isDictionary(&local_268);
      QPDFObjectHandle::~QPDFObjectHandle(&local_268);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_2c0,"/DR",&local_2c1);
        QPDFObjectHandle::getKey(&local_2a0,(string *)(local_d0 + 0x10));
        pQVar2 = (QPDFObjectHandle *)((long)&default_da.field_2 + 8);
        QPDFObjectHandle::operator=(pQVar2,&local_2a0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_2a0);
        std::__cxx11::string::~string(local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        bVar4 = QPDFObjectHandle::isIndirect(pQVar2);
        if (!bVar4) {
          QPDFObjectHandle::QPDFObjectHandle
                    (&local_2e8,(QPDFObjectHandle *)((long)&default_da.field_2 + 8));
          QPDF::makeIndirectObject((QPDF *)&local_2d8,(QPDFObjectHandle *)from_qpdf);
          QPDFObjectHandle::operator=
                    ((QPDFObjectHandle *)((long)&default_da.field_2 + 8),&local_2d8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2d8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
        }
        pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
        QPDFObjectHandle::QPDFObjectHandle
                  (&local_308,(QPDFObjectHandle *)((long)&default_da.field_2 + 8));
        QPDF::copyForeignObject((QPDF *)&local_2f8,pQVar2);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)((long)&default_da.field_2 + 8),&local_2f8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_2f8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_308);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_338,"/DA",&local_339);
      QPDFObjectHandle::getKey(&local_318,(string *)(local_d0 + 0x10));
      bVar4 = QPDFObjectHandle::isString(&local_318);
      QPDFObjectHandle::~QPDFObjectHandle(&local_318);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator(&local_339);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_390,"/DA",&local_391);
        QPDFObjectHandle::getKey(&local_370,(string *)(local_d0 + 0x10));
        QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_360,&local_370);
        std::__cxx11::string::operator=((string *)local_118,(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        QPDFObjectHandle::~QPDFObjectHandle(&local_370);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator(&local_391);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c8,"/Q",&local_3c9);
      QPDFObjectHandle::getKey(&local_3a8,(string *)(local_d0 + 0x10));
      bVar4 = QPDFObjectHandle::isInteger(&local_3a8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3a8);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_400,"/Q",
                   (allocator<char> *)
                   ((long)&dr_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        QPDFObjectHandle::getKey(&local_3e0,(string *)(local_d0 + 0x10));
        from_dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = QPDFObjectHandle::getIntValueAsInt(&local_3e0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_3e0);
        std::__cxx11::string::~string(local_400);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&dr_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      }
    }
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_118,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_150);
    if (bVar4) {
      from_default_da.field_2._M_local_buf[0xe] = '\x01';
    }
    if (from_dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ != local_154) {
      from_default_da.field_2._M_local_buf[0xd] = '\x01';
    }
    std::__cxx11::string::~string((string *)local_150);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         *)local_438);
  dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  QPDFObjectHandle::newNull();
  orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (long)&dr.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 7;
  init_dr_map.initialized_dr_map = (bool *)local_78;
  init_dr_map.this = (QPDFAcroFormDocumentHelper *)&init_dr_map.from_afdh;
  init_dr_map.dr = (QPDFObjectHandle *)((long)&default_da.field_2 + 8);
  init_dr_map.from_dr = (QPDFObjectHandle *)local_438;
  init_dr_map.dr_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        *)&from_afdh;
  init_dr_map.acroform = (QPDFObjectHandle *)this;
  std::
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  ::map((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
         *)&maybe_copy_object.this);
  added_new_fields.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_node_count = (size_t)&maybe_copy_object.this;
  maybe_copy_object.orig_to_copy =
       (map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
        *)this;
  QPDFObjGen::set::set((set *)&__range1);
  QPDFObjectHandle::aitems
            ((QPDFObjectHandle *)
             &__begin1.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  p_Var1 = &__begin1.ivalue.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QPDFObjectHandle::QPDFArrayItems::begin
            ((iterator *)
             &__end1.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFArrayItems *)p_Var1);
  QPDFObjectHandle::QPDFArrayItems::end((iterator *)local_560,(QPDFArrayItems *)p_Var1);
  while (bVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                           ((iterator *)
                            &__end1.ivalue.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            (iterator *)local_560), bVar4) {
    pTVar6 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                       ((iterator *)
                        &__end1.ivalue.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_578,pTVar6);
    bVar4 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_578);
    this_00 = from_afdh;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_598,"ignoring annotation that\'s a stream",
                 (allocator<char> *)
                 ((long)&ffield.m.
                         super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_578,&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ffield.m.
                         super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 3;
    }
    else {
      p_Var1 = &ffield_oh.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)p_Var1,(QPDFObjectHandle *)local_578);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_610,(QPDFObjectHandle *)p_Var1);
      getFieldForAnnotation((QPDFFormFieldObjectHelper *)local_5d8,this_00,&local_610);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_610);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &ffield_oh.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHelper::getObjectHandle
                ((QPDFObjectHelper *)
                 &top_field.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_640);
      local_641 = 0;
      local_642 = false;
      bVar4 = QPDFObjectHandle::isStream
                        ((QPDFObjectHandle *)
                         &top_field.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"ignoring form field that\'s a stream",&local_669);
        QPDFObjectHandle::warnIfPossible
                  ((QPDFObjectHandle *)
                   &top_field.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
      }
      else {
        bVar4 = QPDFObjectHandle::isNull
                          ((QPDFObjectHandle *)
                           &top_field.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if ((bVar4) ||
           (bVar4 = QPDFObjectHandle::isIndirect
                              ((QPDFObjectHandle *)
                               &top_field.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar4)) {
          bVar4 = QPDFObjectHandle::isNull
                            ((QPDFObjectHandle *)
                             &top_field.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
          if (!bVar4) {
            local_641 = 1;
            QPDFFormFieldObjectHelper::getTopLevelField
                      (&local_6e0,(QPDFFormFieldObjectHelper *)local_5d8,&local_642);
            QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_6a8);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)local_640,(QPDFObjectHandle *)local_6a8)
            ;
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_6a8);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_6e0);
            if ((acroform.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
                & 1) == 0) {
              local_728 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_640);
              std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                        (old_fields,&local_728);
            }
            else {
              pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
              QPDFObjectHandle::QPDFObjectHandle(&local_700,(QPDFObjectHandle *)local_640);
              QPDF::copyForeignObject((QPDF *)&local_6f0,pQVar2);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)local_640,&local_6f0);
              QPDFObjectHandle::~QPDFObjectHandle(&local_6f0);
              QPDFObjectHandle::~QPDFObjectHandle(&local_700);
              pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
              QPDFObjectHandle::QPDFObjectHandle
                        (&local_720,
                         (QPDFObjectHandle *)
                         &top_field.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              QPDF::copyForeignObject((QPDF *)&local_710,pQVar2);
              QPDFObjectHandle::operator=
                        ((QPDFObjectHandle *)
                         &top_field.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         &local_710);
              QPDFObjectHandle::~QPDFObjectHandle(&local_710);
              QPDFObjectHandle::~QPDFObjectHandle(&local_720);
            }
            std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::list
                      ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       &seen.
                        super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                        _M_t._M_impl.super__Rb_tree_header._M_node_count);
            QPDFObjGen::set::set((set *)&obj);
            bVar4 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                              ((anon_class_16_2_6a8246dc *)
                               &added_new_fields.
                                super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (QPDFObjectHandle *)local_640);
            if (bVar4) {
              std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                        ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                         &seen.
                          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                          _M_t._M_impl.super__Rb_tree_header._M_node_count,(value_type *)local_640);
            }
            while (bVar4 = std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                           empty((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                 &seen.
                                  super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                  ._M_t._M_impl.super__Rb_tree_header._M_node_count),
                  ((bVar4 ^ 0xffU) & 1) != 0) {
              key = (string *)
                    std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::front
                              ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               &seen.
                                super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                ._M_t._M_impl.super__Rb_tree_header._M_node_count);
              parent.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)key);
              bVar4 = QPDFObjGen::set::add
                                ((set *)&obj,
                                 (QPDFObjGen)
                                 parent.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
              if (bVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&parent_og.gen,"/Parent",
                           (allocator<char> *)((long)&parent_og.obj + 3));
                QPDFObjectHandle::getKey((QPDFObjectHandle *)local_7a0,key);
                std::__cxx11::string::~string((string *)&parent_og.gen);
                std::allocator<char>::~allocator((allocator<char> *)((long)&parent_og.obj + 3));
                bVar4 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_7a0);
                if (bVar4) {
                  local_7cc = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_7a0);
                  sVar7 = std::
                          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                          ::count((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                                   *)&maybe_copy_object.this,&local_7cc);
                  if (sVar7 == 0) {
                    local_8a0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key);
                    QPDFObjGen::unparse_abi_cxx11_(&local_898,&local_8a0,',');
                    std::operator+(&local_878,"while traversing field ",&local_898);
                    std::operator+(&local_858,&local_878,", found parent (");
                    QPDFObjGen::unparse_abi_cxx11_
                              ((string *)
                               &kids.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,&local_7cc,',');
                    std::operator+(&local_838,&local_858,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&kids.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
                    std::operator+(&local_818,&local_838,
                                   ") that had not been seen, indicating likely invalid field structure"
                                  );
                    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_7a0,&local_818);
                    std::__cxx11::string::~string((string *)&local_818);
                    std::__cxx11::string::~string((string *)&local_838);
                    std::__cxx11::string::~string
                              ((string *)
                               &kids.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::__cxx11::string::~string((string *)&local_858);
                    std::__cxx11::string::~string((string *)&local_878);
                    std::__cxx11::string::~string((string *)&local_898);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_7f0,"/Parent",&local_7f1);
                    value = std::
                            map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                            ::operator[]((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                                          *)&maybe_copy_object.this,&local_7cc);
                    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)key,&local_7f0,value);
                    std::__cxx11::string::~string((string *)&local_7f0);
                    std::allocator<char>::~allocator(&local_7f1);
                  }
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&i,"/Kids",
                           (allocator<char> *)
                           ((long)&kid.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 7));
                QPDFObjectHandle::getKey((QPDFObjectHandle *)local_8d0,key);
                std::__cxx11::string::~string((string *)&i);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&kid.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 7));
                bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_8d0);
                if (bVar4) {
                  for (kid.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _0_4_ = 0;
                      iVar3 = (int)kid.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,
                      iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_8d0),
                      iVar3 < iVar5;
                      kid.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                      _0_4_ = (int)kid.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 1) {
                    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_908,(int)local_8d0);
                    bVar4 = transformAnnotations::anon_class_16_2_6a8246dc::operator()
                                      ((anon_class_16_2_6a8246dc *)
                                       &added_new_fields.
                                        super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                        ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                       (QPDFObjectHandle *)local_908);
                    if (bVar4) {
                      QPDFObjectHandle::setArrayItem
                                ((QPDFObjectHandle *)local_8d0,
                                 (int)kid.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi,(QPDFObjectHandle *)local_908);
                      std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                      push_back((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                &seen.
                                 super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                 ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (value_type *)local_908);
                    }
                    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_908);
                  }
                }
                if (((from_default_da.field_2._M_local_buf[0xe] & 1U) != 0) ||
                   ((from_default_da.field_2._M_local_buf[0xd] & 1U) != 0)) {
                  QPDFObjectHandle::QPDFObjectHandle(&local_918,(QPDFObjectHandle *)key);
                  adjustInheritedFields
                            (this,&local_918,(bool)(from_default_da.field_2._M_local_buf[0xe] & 1),
                             (string *)local_118,
                             (bool)(from_default_da.field_2._M_local_buf[0xd] & 1),
                             from_dr.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_);
                  QPDFObjectHandle::~QPDFObjectHandle(&local_918);
                }
                if ((acroform.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _3_1_ & 1) != 0) {
                  transformAnnotations::anon_class_56_7_e075e64c::operator()
                            ((anon_class_56_7_e075e64c *)
                             &orig_to_copy._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_938,"/DR",&local_939);
                  bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)key,&local_938);
                  std::__cxx11::string::~string((string *)&local_938);
                  std::allocator<char>::~allocator(&local_939);
                  if (bVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_960,"/DR",&local_961);
                    QPDFObjectHandle::replaceKey
                              ((QPDFObjectHandle *)key,&local_960,
                               (QPDFObjectHandle *)&init_dr_map.from_afdh);
                    std::__cxx11::string::~string((string *)&local_960);
                    std::allocator<char>::~allocator(&local_961);
                  }
                }
                local_99a = 0;
                local_99b = 0;
                local_99c = 0;
                local_1021 = 0;
                if ((acroform.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _3_1_ & 1) != 0) {
                  std::allocator<char>::allocator();
                  local_99a = 1;
                  std::__cxx11::string::string<std::allocator<char>>(local_998,"/DA",&local_999);
                  local_99b = 1;
                  QPDFObjectHandle::getKey(&local_978,key);
                  local_99c = 1;
                  bVar4 = QPDFObjectHandle::isString(&local_978);
                  local_1021 = 0;
                  if (bVar4) {
                    bVar4 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                     *)local_438);
                    local_1021 = bVar4 ^ 0xff;
                  }
                }
                if ((local_99c & 1) != 0) {
                  QPDFObjectHandle::~QPDFObjectHandle(&local_978);
                }
                if ((local_99b & 1) != 0) {
                  std::__cxx11::string::~string(local_998);
                }
                if ((local_99a & 1) != 0) {
                  std::allocator<char>::~allocator(&local_999);
                }
                if ((local_1021 & 1) != 0) {
                  QPDFObjectHandle::QPDFObjectHandle(&local_9b0,(QPDFObjectHandle *)key);
                  adjustDefaultAppearances
                            (this,&local_9b0,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                              *)local_438);
                  QPDFObjectHandle::~QPDFObjectHandle(&local_9b0);
                }
                QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_8d0);
                QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_7a0);
              }
              std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_front
                        ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                         &seen.
                          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                          _M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            transformAnnotations::anon_class_16_2_6a8246dc::operator()
                      ((anon_class_16_2_6a8246dc *)
                       &added_new_fields.
                        super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                        _M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (QPDFObjectHandle *)
                       &top_field.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFObjectHandle::QPDFObjectHandle
                      (&local_9f8,
                       (QPDFObjectHandle *)
                       &top_field.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_9e8,&local_9f8);
            QPDFFormFieldObjectHelper::operator=((QPDFFormFieldObjectHelper *)local_5d8,&local_9e8);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_9e8);
            QPDFObjectHandle::~QPDFObjectHandle(&local_9f8);
            QPDFObjGen::set::~set((set *)&obj);
            std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~list
                      ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       &seen.
                        super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                        _M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_690,"ignoring form field not indirect",
                     (allocator<char> *)(local_6a8 + 0x17));
          QPDFObjectHandle::warnIfPossible
                    ((QPDFObjectHandle *)
                     &top_field.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_690);
          std::__cxx11::string::~string((string *)&local_690);
          std::allocator<char>::~allocator((allocator<char> *)(local_6a8 + 0x17));
        }
      }
      QTC::TC("qpdf","QPDFAcroFormDocumentHelper copy annotation",
              (local_641 & 1) +
              (acroform.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ &
              1) * 2);
      if ((local_641 & 1) != 0) {
        QTC::TC("qpdf","QPDFAcroFormDocumentHelper field with parent",
                (local_642 & 1) +
                (acroform.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
                & 1) * 2);
      }
      if ((acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._3_1_ & 1) != 0) {
        bVar4 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_578);
        if (!bVar4) {
          QPDFObjectHandle::QPDFObjectHandle(&local_a18,(QPDFObjectHandle *)local_578);
          QPDF::makeIndirectObject((QPDF *)&local_a08,(QPDFObjectHandle *)from_qpdf);
          QPDFObjectHandle::operator=((QPDFObjectHandle *)local_578,&local_a08);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a08);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a18);
        }
        pQVar2 = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
        QPDFObjectHandle::QPDFObjectHandle(&local_a38,(QPDFObjectHandle *)local_578);
        QPDF::copyForeignObject((QPDF *)&local_a28,pQVar2);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_578,&local_a28);
        QPDFObjectHandle::~QPDFObjectHandle(&local_a28);
        QPDFObjectHandle::~QPDFObjectHandle(&local_a38);
      }
      transformAnnotations::anon_class_16_2_6a8246dc::operator()
                ((anon_class_16_2_6a8246dc *)
                 &added_new_fields.
                  super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
                  _M_impl.super__Rb_tree_header._M_node_count,(QPDFObjectHandle *)local_578);
      if ((local_641 & 1) != 0) {
        ah.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_640);
        bVar4 = QPDFObjGen::set::add
                          ((set *)&__range1,
                           (QPDFObjGen)
                           ah.m.
                           super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        if (bVar4) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (new_fields,(value_type *)local_640);
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (new_annots,(value_type *)local_578);
      p_Var1 = &apdict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)p_Var1,(QPDFObjectHandle *)local_578);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                ((QPDFAnnotationObjectHelper *)local_a78,(QPDFObjectHandle *)p_Var1);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &apdict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFAnnotationObjectHelper::getAppearanceDictionary
                ((QPDFAnnotationObjectHelper *)
                 &streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0);
      QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin2,(char)&streams + 0x10);
      __end2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin2);
      local_ae0._M_node =
           (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin2);
      while (bVar4 = std::operator!=(&__end2,&local_ae0), bVar4) {
        key1 = &std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                ::operator*(&__end2)->first;
        value1 = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                   ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                     *)key1);
        local_af8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                *)key1);
        bVar4 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_af8);
        if (bVar4) {
          transformAnnotations(QPDFObjectHandle,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::set<QPDFObjGen,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>&,QPDFMatrix_const&,QPDF*,QPDFAcroFormDocumentHelper*)
          ::$_0::operator()((__0 *)&__range4,(QPDFObjectHandle *)((long)&__range2 + 7),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &streams.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,value1);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0,
                     (QPDFObjectHandle *)&__range4);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range4);
        }
        else {
          QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin4,(typed)local_af8);
          __end4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin4);
          local_b30._M_node =
               (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin4);
          while (bVar4 = std::operator!=(&__end4,&local_b30), bVar4) {
            key2 = &std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                    ::operator*(&__end4)->first;
            value2 = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                         *)key2);
            local_b48 = std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                    *)key2);
            bVar4 = QPDFObjectHandle::isStream(local_b48);
            if (bVar4) {
              transformAnnotations(QPDFObjectHandle,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>&,std::set<QPDFObjGen,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>&,QPDFMatrix_const&,QPDF*,QPDFAcroFormDocumentHelper*)
              ::$_0::operator()((__0 *)&__range2_1,(QPDFObjectHandle *)((long)&__range2 + 7),
                                local_af8,value2);
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
              emplace_back<QPDFObjectHandle>
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0,
                         (QPDFObjectHandle *)&__range2_1);
              QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2_1);
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
            ::operator++(&__end4);
          }
          annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 0xc;
          ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin4);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
        ::operator++(&__end2);
      }
      annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 10;
      ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin2);
      __end2_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                           ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0
                           );
      stream = (QPDFObjectHandle *)
               std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                         ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                 *)&stream),
            this_01 = afdhph.
                      super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount, bVar4) {
        pQVar8 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2_1);
        QPDFObjectHandle::getDict
                  ((QPDFObjectHandle *)
                   &omatrix.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_bb8,"/Matrix",(allocator<char> *)((long)&apcm.f + 7));
        QPDFObjectHandle::getKey
                  ((QPDFObjectHandle *)local_b98,
                   (string *)
                   &omatrix.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_bb8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&apcm.f + 7));
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)&m1.f);
        bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_b98);
        if (bVar4) {
          QTC::TC("qpdf","QPDFAcroFormDocumentHelper modify ap matrix",0);
          QPDFObjectHandle::getArrayAsMatrix((Matrix *)local_c20,(QPDFObjectHandle *)local_b98);
          QPDFMatrix::QPDFMatrix
                    ((QPDFMatrix *)
                     &new_matrix.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Matrix *)local_c20);
          memcpy(&m1.f,&new_matrix.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0x30)
          ;
        }
        QPDFMatrix::concat((QPDFMatrix *)&m1.f,
                           (QPDFMatrix *)
                           afdhph.
                           super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        QPDFObjectHandle::newFromMatrix((QPDFObjectHandle *)local_c60,(QPDFMatrix *)&m1.f);
        bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_b98);
        local_10cb = true;
        if (!bVar4) {
          QPDFMatrix::QPDFMatrix(&local_c90);
          local_10cb = QPDFMatrix::operator!=((QPDFMatrix *)&m1.f,&local_c90);
        }
        if (local_10cb != false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_cb0,"/Matrix",
                     (allocator<char> *)
                     ((long)&resources.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)
                     &omatrix.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_cb0,(QPDFObjectHandle *)local_c60);
          std::__cxx11::string::~string((string *)&local_cb0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&resources.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_ce8,"/Resources",&local_ce9);
        QPDFObjectHandle::getKey
                  ((QPDFObjectHandle *)local_cc8,
                   (string *)
                   &omatrix.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_ce8);
        std::allocator<char>::~allocator(&local_ce9);
        bVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                         *)local_438);
        if ((!bVar4) &&
           (bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_cc8), bVar4)) {
          QPDFObjectHandle::QPDFObjectHandle(&local_d00,pQVar8);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 *)&rect.ury,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 *)local_438);
          adjustAppearanceStream
                    (this,&local_d00,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)&rect.ury);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)&rect.ury);
          QPDFObjectHandle::~QPDFObjectHandle(&local_d00);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_cc8);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c60);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b98);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &omatrix.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        __gnu_cxx::
        __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
        ::operator++(&__end2_1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_da0,"/Rect",&local_da1);
      QPDFObjectHandle::getKey(&local_d80,(string *)local_578);
      QPDFObjectHandle::getArrayAsRectangle(&local_d70,&local_d80);
      r.lly = local_d70.lly;
      r.llx = local_d70.llx;
      r.urx = local_d70.urx;
      r.ury = local_d70.ury;
      QPDFMatrix::transformRectangle((Rectangle *)local_d50,(QPDFMatrix *)this_01._M_pi,r);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d80);
      std::__cxx11::string::~string(local_da0);
      std::allocator<char>::~allocator(&local_da1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"/Rect",&local_dc9);
      QPDFObjectHandle::newFromRectangle(&local_de0,(Rectangle *)local_d50);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_578,&local_dc8,&local_de0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_de0);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::allocator<char>::~allocator(&local_dc9);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_ab0);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                ((QPDFAnnotationObjectHelper *)local_a78);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_640);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &top_field.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_5d8);
      annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_578);
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++
              ((iterator *)
               &__end1.ivalue.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  annot.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 2;
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_560);
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
            ((QPDFArrayItems *)
             &__begin1.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjGen::set::~set((set *)&__range1);
  std::
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  ::~map((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          *)&maybe_copy_object.this);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&init_dr_map.from_afdh);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *)local_438);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&default_da.field_2 + 8));
  std::__cxx11::string::~string((string *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_d0 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
            ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_48);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::transformAnnotations(
    QPDFObjectHandle old_annots,
    std::vector<QPDFObjectHandle>& new_annots,
    std::vector<QPDFObjectHandle>& new_fields,
    std::set<QPDFObjGen>& old_fields,
    QPDFMatrix const& cm,
    QPDF* from_qpdf,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    if (!from_qpdf) {
        // Assume these are from the same QPDF.
        from_qpdf = &qpdf;
        from_afdh = this;
    } else if ((from_qpdf != &qpdf) && (!from_afdh)) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(*from_qpdf);
        from_afdh = afdhph.get();
    }
    bool foreign = (from_qpdf != &qpdf);

    // It's possible that we will transform annotations that don't include any form fields. This
    // code takes care not to muck around with /AcroForm unless we have to.

    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    QPDFObjectHandle from_acroform = from_qpdf->getRoot().getKey("/AcroForm");

    // /DA and /Q may be inherited from the document-level /AcroForm dictionary. If we are copying a
    // foreign stream and the stream is getting one of these values from its document's /AcroForm,
    // we will need to copy the value explicitly so that it doesn't start getting its default from
    // the destination document.
    bool override_da = false;
    bool override_q = false;
    std::string from_default_da;
    int from_default_q = 0;
    // If we copy any form fields, we will need to merge the source document's /DR into this
    // document's /DR.
    QPDFObjectHandle from_dr = QPDFObjectHandle::newNull();
    if (foreign) {
        std::string default_da;
        int default_q = 0;
        if (acroform.isDictionary()) {
            if (acroform.getKey("/DA").isString()) {
                default_da = acroform.getKey("/DA").getUTF8Value();
            }
            if (acroform.getKey("/Q").isInteger()) {
                default_q = acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_acroform.isDictionary()) {
            if (from_acroform.getKey("/DR").isDictionary()) {
                from_dr = from_acroform.getKey("/DR");
                if (!from_dr.isIndirect()) {
                    from_dr = from_qpdf->makeIndirectObject(from_dr);
                }
                from_dr = qpdf.copyForeignObject(from_dr);
            }
            if (from_acroform.getKey("/DA").isString()) {
                from_default_da = from_acroform.getKey("/DA").getUTF8Value();
            }
            if (from_acroform.getKey("/Q").isInteger()) {
                from_default_q = from_acroform.getKey("/Q").getIntValueAsInt();
            }
        }
        if (from_default_da != default_da) {
            override_da = true;
        }
        if (from_default_q != default_q) {
            override_q = true;
        }
    }

    // If we have to merge /DR, we will need a mapping of conflicting keys for rewriting /DA. Set
    // this up for lazy initialization in case we encounter any form fields.
    std::map<std::string, std::map<std::string, std::string>> dr_map;
    bool initialized_dr_map = false;
    QPDFObjectHandle dr = QPDFObjectHandle::newNull();
    auto init_dr_map = [&]() {
        if (!initialized_dr_map) {
            initialized_dr_map = true;
            // Ensure that we have a /DR that is an indirect
            // dictionary object.
            if (!acroform.isDictionary()) {
                acroform = getOrCreateAcroForm();
            }
            dr = acroform.getKey("/DR");
            if (!dr.isDictionary()) {
                dr = QPDFObjectHandle::newDictionary();
            }
            dr.makeResourcesIndirect(qpdf);
            if (!dr.isIndirect()) {
                dr = acroform.replaceKeyAndGetNew("/DR", qpdf.makeIndirectObject(dr));
            }
            // Merge the other document's /DR, creating a conflict map. mergeResources checks to
            // make sure both objects are dictionaries. By this point, if this is foreign, from_dr
            // has been copied, so we use the target qpdf as the owning qpdf.
            from_dr.makeResourcesIndirect(qpdf);
            dr.mergeResources(from_dr, &dr_map);

            if (from_afdh->getNeedAppearances()) {
                setNeedAppearances(true);
            }
        }
    };

    // This helper prevents us from copying the same object multiple times.
    std::map<QPDFObjGen, QPDFObjectHandle> orig_to_copy;
    auto maybe_copy_object = [&](QPDFObjectHandle& to_copy) {
        auto og = to_copy.getObjGen();
        if (orig_to_copy.count(og)) {
            to_copy = orig_to_copy[og];
            return false;
        } else {
            to_copy = qpdf.makeIndirectObject(to_copy.shallowCopy());
            orig_to_copy[og] = to_copy;
            return true;
        }
    };

    // Now do the actual copies.

    QPDFObjGen::set added_new_fields;
    for (auto annot: old_annots.aitems()) {
        if (annot.isStream()) {
            annot.warnIfPossible("ignoring annotation that's a stream");
            continue;
        }

        // Make copies of annotations and fields down to the appearance streams, preserving all
        // internal referential integrity. When the incoming annotations are from a different file,
        // we first copy them locally. Then, whether local or foreign, we copy them again so that if
        // we bring the same annotation in multiple times (e.g. overlaying a foreign page onto
        // multiple local pages or a local page onto multiple other local pages), we don't create
        // annotations that are referenced in more than one place. If we did that, the effect of
        // applying transformations would be cumulative, which is definitely not what we want.
        // Besides, annotations and fields are not intended to be referenced in multiple places.

        // Determine if this annotation is attached to a form field. If so, the annotation may be
        // the same object as the form field, or the form field may have the annotation as a kid. In
        // either case, we have to walk up the field structure to find the top-level field. Within
        // one iteration through a set of annotations, we don't want to copy the same item more than
        // once. For example, suppose we have field A with kids B, C, and D, each of which has
        // annotations BA, CA, and DA. When we get to BA, we will find that BA is a kid of B which
        // is under A. When we do a copyForeignObject of A, it will also copy everything else
        // because of the indirect references. When we clone BA, we will want to clone A and then
        // update A's clone's kid to point B's clone and B's clone's parent to point to A's clone.
        // The same thing holds for annotations. Next, when we get to CA, we will again discover
        // that A is the top, but we don't want to re-copy A. We want CA's clone to be linked to the
        // same clone as BA's. Failure to do this will break up things like radio button groups,
        // which all have to kids of the same parent.

        auto ffield = from_afdh->getFieldForAnnotation(annot);
        auto ffield_oh = ffield.getObjectHandle();
        QPDFObjectHandle top_field;
        bool have_field = false;
        bool have_parent = false;
        if (ffield_oh.isStream()) {
            ffield_oh.warnIfPossible("ignoring form field that's a stream");
        } else if ((!ffield_oh.isNull()) && (!ffield_oh.isIndirect())) {
            ffield_oh.warnIfPossible("ignoring form field not indirect");
        } else if (!ffield_oh.isNull()) {
            // A field and its associated annotation can be the same object. This matters because we
            // don't want to clone the annotation and field separately in this case.
            have_field = true;
            // Find the top-level field. It may be the field itself.
            top_field = ffield.getTopLevelField(&have_parent).getObjectHandle();
            if (foreign) {
                // copyForeignObject returns the same value if called multiple times with the same
                // field. Create/retrieve the local copy of the original field. This pulls over
                // everything the field references including annotations and appearance streams, but
                // it's harmless to call copyForeignObject on them too. They will already be copied,
                // so we'll get the right object back.

                // top_field and ffield_oh are known to be indirect.
                top_field = qpdf.copyForeignObject(top_field);
                ffield_oh = qpdf.copyForeignObject(ffield_oh);
            } else {
                // We don't need to add top_field to old_fields if it's foreign because the new copy
                // of the foreign field won't be referenced anywhere. It's just the starting point
                // for us to make an additional local copy of.
                old_fields.insert(top_field.getObjGen());
            }

            // Traverse the field, copying kids, and preserving integrity.
            std::list<QPDFObjectHandle> queue;
            QPDFObjGen::set seen;
            if (maybe_copy_object(top_field)) {
                queue.push_back(top_field);
            }
            for (; !queue.empty(); queue.pop_front()) {
                auto& obj = queue.front();
                if (seen.add(obj)) {
                    auto parent = obj.getKey("/Parent");
                    if (parent.isIndirect()) {
                        auto parent_og = parent.getObjGen();
                        if (orig_to_copy.count(parent_og)) {
                            obj.replaceKey("/Parent", orig_to_copy[parent_og]);
                        } else {
                            parent.warnIfPossible(
                                "while traversing field " + obj.getObjGen().unparse(',') +
                                ", found parent (" + parent_og.unparse(',') +
                                ") that had not been seen, indicating likely invalid field "
                                "structure");
                        }
                    }
                    auto kids = obj.getKey("/Kids");
                    if (kids.isArray()) {
                        for (int i = 0; i < kids.getArrayNItems(); ++i) {
                            auto kid = kids.getArrayItem(i);
                            if (maybe_copy_object(kid)) {
                                kids.setArrayItem(i, kid);
                                queue.push_back(kid);
                            }
                        }
                    }

                    if (override_da || override_q) {
                        adjustInheritedFields(
                            obj, override_da, from_default_da, override_q, from_default_q);
                    }
                    if (foreign) {
                        // Lazily initialize our /DR and the conflict map.
                        init_dr_map();
                        // The spec doesn't say anything about /DR on the field, but lots of writers
                        // put one there, and it is frequently the same as the document-level /DR.
                        // To avoid having the field's /DR point to information that we are not
                        // maintaining, just reset it to that if it exists. Empirical evidence
                        // suggests that many readers, including Acrobat, Adobe Acrobat Reader,
                        // chrome, firefox, the mac Preview application, and several of the free
                        // readers on Linux all ignore /DR at the field level.
                        if (obj.hasKey("/DR")) {
                            obj.replaceKey("/DR", dr);
                        }
                    }
                    if (foreign && obj.getKey("/DA").isString() && (!dr_map.empty())) {
                        adjustDefaultAppearances(obj, dr_map);
                    }
                }
            }

            // Now switch to copies. We already switched for top_field
            maybe_copy_object(ffield_oh);
            ffield = QPDFFormFieldObjectHelper(ffield_oh);
        }

        QTC::TC(
            "qpdf",
            "QPDFAcroFormDocumentHelper copy annotation",
            (have_field ? 1 : 0) | (foreign ? 2 : 0));
        if (have_field) {
            QTC::TC(
                "qpdf",
                "QPDFAcroFormDocumentHelper field with parent",
                (have_parent ? 1 : 0) | (foreign ? 2 : 0));
        }
        if (foreign) {
            if (!annot.isIndirect()) {
                annot = from_qpdf->makeIndirectObject(annot);
            }
            annot = qpdf.copyForeignObject(annot);
        }
        maybe_copy_object(annot);

        // Now we have copies, so we can safely mutate.
        if (have_field && added_new_fields.add(top_field)) {
            new_fields.push_back(top_field);
        }
        new_annots.push_back(annot);

        // Identify and copy any appearance streams

        auto ah = QPDFAnnotationObjectHelper(annot);
        auto apdict = ah.getAppearanceDictionary();
        std::vector<QPDFObjectHandle> streams;
        auto replace_stream = [](auto& dict, auto& key, auto& old) {
            return dict.replaceKeyAndGetNew(key, old.copyStream());
        };

        for (auto& [key1, value1]: apdict.as_dictionary()) {
            if (value1.isStream()) {
                streams.emplace_back(replace_stream(apdict, key1, value1));
            } else {
                for (auto& [key2, value2]: value1.as_dictionary()) {
                    if (value2.isStream()) {
                        streams.emplace_back(replace_stream(value1, key2, value2));
                    }
                }
            }
        }

        // Now we can safely mutate the annotation and its appearance streams.
        for (auto& stream: streams) {
            auto dict = stream.getDict();
            auto omatrix = dict.getKey("/Matrix");
            QPDFMatrix apcm;
            if (omatrix.isArray()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper modify ap matrix");
                auto m1 = omatrix.getArrayAsMatrix();
                apcm = QPDFMatrix(m1);
            }
            apcm.concat(cm);
            auto new_matrix = QPDFObjectHandle::newFromMatrix(apcm);
            if (omatrix.isArray() || (apcm != QPDFMatrix())) {
                dict.replaceKey("/Matrix", new_matrix);
            }
            auto resources = dict.getKey("/Resources");
            if ((!dr_map.empty()) && resources.isDictionary()) {
                adjustAppearanceStream(stream, dr_map);
            }
        }
        auto rect = cm.transformRectangle(annot.getKey("/Rect").getArrayAsRectangle());
        annot.replaceKey("/Rect", QPDFObjectHandle::newFromRectangle(rect));
    }
}